

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::Cord::AppendImpl<absl::lts_20240722::Cord_const&>(Cord *this,Cord *src)

{
  byte bVar1;
  byte bVar2;
  Nonnull<CordRep_*> pCVar3;
  CordRep *pCVar4;
  ulong uVar5;
  SamplingState *pSVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  uint8_t *puVar10;
  CordRep *pCVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dd;
  string_view src_00;
  ChunkIterator __begin0;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  Nullable<absl::cord_internal::CordRep_*> local_a8;
  size_t sStack_a0;
  CordRepBtreeReader local_98;
  
  pCVar11 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar11 != (CordRep *)0x0 && ((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) &&
     (pCVar11->length == 0)) goto LAB_0011129b;
  do {
    bVar1 = (byte)((CordRepBtreeReader *)src)->remaining_;
    uVar5 = (ulong)(char)bVar1;
    if ((uVar5 & 1) == 0) {
      uVar8 = uVar5 >> 1;
    }
    else {
      uVar8 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    if (uVar8 == 0) {
      return;
    }
    uVar8 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar8 & 1) == 0) {
      uVar8 = uVar8 >> 1;
    }
    else {
      uVar8 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (uVar8 == 0) {
      if ((bVar1 & 1) == 0) {
        pCVar11 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
             ((CordRepBtreeReader *)src)->remaining_;
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar11;
      }
      else {
        pCVar11 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        if (pCVar11 == (CordRep *)0x0) goto LAB_001113ba;
        LOCK();
        (pCVar11->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar11->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if (pCVar11->tag == '\x02') {
          pCVar4 = (CordRep *)pCVar11[1].length;
          if ((pCVar11->refcount).count_.super___atomic_base<int>._M_i == 2) {
            if (pCVar11->tag != '\x02') goto LAB_00111417;
            absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState
                      ((CrcCordState *)&pCVar11[1].refcount);
            operator_delete(pCVar11,0x20);
            pCVar11 = pCVar4;
          }
          else {
            if (pCVar4 == (CordRep *)0x0) goto LAB_001113ba;
            LOCK();
            (pCVar4->refcount).count_.super___atomic_base<int>._M_i =
                 (pCVar4->refcount).count_.super___atomic_base<int>._M_i + 2;
            UNLOCK();
            cord_internal::CordRep::Unref(pCVar11);
            pCVar11 = pCVar4;
          }
        }
        if (pCVar11 == (CordRep *)0x0) {
          __assert_fail("rep",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                        ,0x4f2,
                        "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                       );
        }
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar11;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
        pSVar6 = (SamplingState *)__tls_get_addr(&PTR_0011efd0);
        if (pSVar6->next_sample < 2) {
          lVar7 = absl::lts_20240722::cord_internal::cordz_should_profile_slow(pSVar6);
        }
        else {
          pSVar6->next_sample = pSVar6->next_sample + -1;
          lVar7 = 0;
        }
        if (0 < lVar7) {
          absl::lts_20240722::cord_internal::CordzInfo::TrackCord
                    ((InlineData *)this,kAppendCord,lVar7);
          return;
        }
      }
      return;
    }
    if ((uVar5 & 1) == 0) {
      uVar8 = uVar5 >> 1;
    }
    else {
      uVar8 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    bVar12 = (bVar1 & 1) == 0;
    pCVar11 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
    if (0x1ff < uVar8) {
      if (pCVar11 == (CordRep *)0x0 || bVar12) {
LAB_001113ba:
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      (pCVar11->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar11->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if (pCVar11->tag == '\x02') {
        pCVar3 = (Nonnull<CordRep_*>)pCVar11[1].length;
        if ((pCVar11->refcount).count_.super___atomic_base<int>._M_i == 2) {
          if (pCVar11->tag != '\x02') {
LAB_00111417:
            __assert_fail("IsCrc()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                          ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
          }
          absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState
                    ((CrcCordState *)&pCVar11[1].refcount);
          operator_delete(pCVar11,0x20);
          pCVar11 = pCVar3;
        }
        else {
          if (pCVar3 == (Nonnull<CordRep_*>)0x0) goto LAB_001113ba;
          LOCK();
          (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
          cord_internal::CordRep::Unref(pCVar11);
          pCVar11 = pCVar3;
        }
      }
      InlineRep::AppendTree(&this->contents_,pCVar11,kAppendCord);
      return;
    }
    if (pCVar11 == (CordRep *)0x0 || bVar12) {
      puVar10 = (uint8_t *)0x0;
      if ((uVar5 & 1) == 0) {
        puVar10 = (uint8_t *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
      }
LAB_00111168:
      src_00._M_str = (char *)puVar10;
      src_00._M_len = uVar8;
      InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
      return;
    }
    bVar2 = pCVar11->tag;
    if (5 < bVar2) {
      if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      puVar10 = pCVar11->storage;
      goto LAB_00111168;
    }
    if (src == this) {
      Cord((Cord *)local_b8,src);
      AppendImpl<absl::lts_20240722::Cord>(this,(Cord *)local_b8);
      ~Cord((Cord *)local_b8);
      return;
    }
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    local_a8 = (Nullable<absl::cord_internal::CordRep_*>)0x0;
    sStack_a0 = 0;
    _local_b8 = (string_view)ZEXT816(0);
    local_98.remaining_ = 0;
    local_98.navigator_.height_ = -1;
    if (pCVar11 == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      if ((bVar1 & 1) == 0) {
        sStack_a0 = uVar5 >> 1;
        stack0xffffffffffffff50 = (char *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
        local_b8._0_8_ = sStack_a0;
      }
      else {
        AppendImpl<absl::lts_20240722::Cord_const&>();
        uVar13 = extraout_XMM0_Da;
        uVar14 = extraout_XMM0_Db;
        uVar15 = extraout_XMM0_Dc;
        uVar16 = extraout_XMM0_Dd;
LAB_00111373:
        local_b8._4_4_ = uVar14;
        local_b8._0_4_ = uVar13;
        local_b8._8_4_ = uVar15;
        uStack_ac = uVar16;
      }
    }
    else {
      sStack_a0 = pCVar11->length;
      if (sStack_a0 == 0) goto LAB_00111373;
      ChunkIterator::InitTree((ChunkIterator *)local_b8,pCVar11);
    }
    if (sStack_a0 == 0) {
      return;
    }
    src = (Cord *)&local_98;
    while (InlineRep::AppendArray(&this->contents_,_local_b8,kAppendString), sStack_a0 != 0) {
      sVar9 = sStack_a0 - local_b8._0_8_;
      if (sStack_a0 < (ulong)local_b8._0_8_) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      sStack_a0 = sVar9;
      if (sVar9 != 0) {
        if (((long)local_98.navigator_.height_ < 0) ||
           (local_98.navigator_.node_[local_98.navigator_.height_] == (CordRepBtree *)0x0)) {
          if (local_b8._0_8_ == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          _local_b8 = (string_view)ZEXT816(0);
        }
        else {
          _local_b8 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)src);
        }
      }
      if (sStack_a0 == 0) {
        return;
      }
    }
    AppendImpl<absl::lts_20240722::Cord_const&>();
LAB_0011129b:
    AppendImpl<absl::lts_20240722::Cord_const&>();
  } while( true );
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}